

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_extra.c
# Opt level: O0

void jp2_write_colr(opj_jp2_t *jp2,opj_cio_t *cio)

{
  opj_cio_t *in_RDI;
  opj_jp2_t *unaff_retaddr;
  
  jp2_write_colr_real(unaff_retaddr,in_RDI);
  jp2_write_pclr(jp2,cio);
  jp2_write_cmap(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void jp2_write_colr(opj_jp2_t * jp2, opj_cio_t * cio)
{
    jp2_write_colr_real(jp2, cio);
    jp2_write_pclr(jp2, cio);
    jp2_write_cmap(jp2, cio);
}